

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O3

void __thiscall IsoWriter::writeFileSetDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  size_t in_RCX;
  uint32_t *buff32;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\0';
  this->m_buffer[1] = '\x01';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  anon_unknown.dwarf_1250c1::writeTimestamp(this->m_buffer + 0x10,this->m_currentTime);
  this->m_buffer[0x1c] = '\x03';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\x03';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0x20] = '\x01';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  this->m_buffer[0x24] = '\x01';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  this->m_buffer[0x28] = '\0';
  this->m_buffer[0x29] = '\0';
  this->m_buffer[0x2a] = '\0';
  this->m_buffer[0x2b] = '\0';
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x41] = 'U';
  this->m_buffer[0x42] = 'n';
  this->m_buffer[0x43] = 'i';
  this->m_buffer[0x44] = 'c';
  this->m_buffer[0x45] = 'o';
  this->m_buffer[0x46] = 'd';
  this->m_buffer[0x47] = 'e';
  this->m_buffer[0x48] = '\0';
  this->m_buffer[0x31] = 'O';
  this->m_buffer[0x32] = 'S';
  this->m_buffer[0x33] = 'T';
  this->m_buffer[0x34] = 'A';
  this->m_buffer[0x35] = ' ';
  this->m_buffer[0x36] = 'C';
  this->m_buffer[0x37] = 'o';
  this->m_buffer[0x38] = 'm';
  this->m_buffer[0x39] = 'p';
  this->m_buffer[0x3a] = 'r';
  this->m_buffer[0x3b] = 'e';
  this->m_buffer[0x3c] = 's';
  this->m_buffer[0x3d] = 's';
  this->m_buffer[0x3e] = 'e';
  this->m_buffer[0x3f] = 'd';
  this->m_buffer[0x40] = ' ';
  anon_unknown.dwarf_1250c1::writeDString
            (this->m_buffer + 0x70,(this->m_volumeLabel)._M_dataplus._M_p,0x80);
  this->m_buffer[0x101] = 'U';
  this->m_buffer[0x102] = 'n';
  this->m_buffer[0x103] = 'i';
  this->m_buffer[0x104] = 'c';
  this->m_buffer[0x105] = 'o';
  this->m_buffer[0x106] = 'd';
  this->m_buffer[0x107] = 'e';
  this->m_buffer[0x108] = '\0';
  this->m_buffer[0xf1] = 'O';
  this->m_buffer[0xf2] = 'S';
  this->m_buffer[0xf3] = 'T';
  this->m_buffer[0xf4] = 'A';
  this->m_buffer[0xf5] = ' ';
  this->m_buffer[0xf6] = 'C';
  this->m_buffer[0xf7] = 'o';
  this->m_buffer[0xf8] = 'm';
  this->m_buffer[0xf9] = 'p';
  this->m_buffer[0xfa] = 'r';
  this->m_buffer[0xfb] = 'e';
  this->m_buffer[0xfc] = 's';
  this->m_buffer[0xfd] = 's';
  this->m_buffer[0xfe] = 'e';
  this->m_buffer[0xff] = 'd';
  this->m_buffer[0x100] = ' ';
  anon_unknown.dwarf_1250c1::writeDString
            (this->m_buffer + 0x130,(this->m_volumeLabel)._M_dataplus._M_p,0x20);
  this->m_buffer[400] = '\0';
  this->m_buffer[0x191] = '\b';
  this->m_buffer[0x192] = '\0';
  this->m_buffer[0x193] = '\0';
  this->m_buffer[0x194] = '\x02';
  this->m_buffer[0x195] = '\0';
  this->m_buffer[0x196] = '\0';
  this->m_buffer[0x197] = '\0';
  this->m_buffer[0x198] = '\x01';
  this->m_buffer[0x199] = '\0';
  this->m_buffer[0x19c] = '\0';
  this->m_buffer[0x19d] = '\0';
  this->m_buffer[0x19e] = '\0';
  this->m_buffer[0x19f] = '\0';
  this->m_buffer[0x1a1] = '*';
  this->m_buffer[0x1a2] = 'O';
  this->m_buffer[0x1a3] = 'S';
  this->m_buffer[0x1a4] = 'T';
  this->m_buffer[0x1a5] = 'A';
  this->m_buffer[0x1a6] = ' ';
  this->m_buffer[0x1a7] = 'U';
  this->m_buffer[0x1a8] = 'D';
  this->m_buffer[0x1a9] = 'F';
  this->m_buffer[0x1aa] = ' ';
  this->m_buffer[0x1ab] = 'C';
  this->m_buffer[0x1ac] = 'o';
  this->m_buffer[0x1ad] = 'm';
  this->m_buffer[0x1ae] = 'p';
  this->m_buffer[0x1af] = 'l';
  this->m_buffer[0x1b0] = 'i';
  this->m_buffer[0x1b1] = 'a';
  this->m_buffer[0x1b2] = 'n';
  this->m_buffer[0x1b3] = 't';
  this->m_buffer[0x1b4] = '\0';
  this->m_buffer[0x1b8] = 'P';
  this->m_buffer[0x1b9] = '\x02';
  this->m_buffer[0x1ba] = '\x03';
  this->m_buffer[0x1c0] = '\0';
  this->m_buffer[0x1c1] = '\0';
  this->m_buffer[0x1c2] = '\0';
  this->m_buffer[0x1c3] = '\0';
  this->m_buffer[0x1c4] = '\0';
  this->m_buffer[0x1c5] = '\0';
  this->m_buffer[0x1c6] = '\0';
  this->m_buffer[0x1c7] = '\0';
  this->m_buffer[0x1c8] = '\0';
  this->m_buffer[0x1c9] = '\0';
  this->m_buffer[0x1cc] = '\0';
  this->m_buffer[0x1cd] = '\0';
  this->m_buffer[0x1ce] = '\0';
  this->m_buffer[0x1cf] = '\0';
  this->m_buffer[0x1d0] = '\0';
  this->m_buffer[0x1d1] = '\b';
  this->m_buffer[0x1d2] = '\0';
  this->m_buffer[0x1d3] = '\0';
  *(int *)(this->m_buffer + 0x1d4) = this->m_systemStreamLBN;
  this->m_buffer[0x1d8] = '\x01';
  this->m_buffer[0x1d9] = '\0';
  this->m_buffer[0x1dc] = '\0';
  this->m_buffer[0x1dd] = '\0';
  this->m_buffer[0x1de] = '\0';
  this->m_buffer[0x1df] = '\0';
  anon_unknown.dwarf_1250c1::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,in_RCX);
  return;
}

Assistant:

void IsoWriter::writeFileSetDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::FileSet, absoluteSectorNum());

    writer.writeTimestamp(m_currentTime);  // Recording Date and Time
    writer.writeLE16(0x03);                // Interchange Level
    writer.writeLE16(0x03);                // Maximum Interchange Level
    writer.writeLE32(0x01);                // Character Set List
    writer.writeLE32(0x01);                // Maximum Character Set List
    writer.writeLE32(0x00);                // File Set Number
    writer.writeLE32(0x00);                // File Set Descriptor Number
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);
    writer.writeDString(m_volumeLabel, 128);                    // Logical Volume Identifier
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);  // File Set Character Set
    writer.writeDString(m_volumeLabel, 32);                     // File Set Identifier
    writer.skipBytes(32);                                       // Copyright File Identifier
    writer.skipBytes(32);                                       // Abstract File Identifier
    writer.writeLongAD(0x0800, 2, 1, 0);                        // Root Directory ICB
    writer.writeUDFString("*OSTA UDF Compliant", 32);           // Domain Identifier
    m_buffer[442] = 0x03;                                       // Domain Flags: Hard and Soft Write-Protect
    writer.writeLongAD(0, 0, 0, 0);                             // Next Extent
    writer.writeLongAD(0x0800, m_systemStreamLBN, 1, 0);

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}